

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_avx512::create_pipeline(InnerProduct_x86_avx512 *this,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  _func_int *p_Var5;
  size_t sVar6;
  Allocator *pAVar7;
  int *piVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined8 uVar21;
  undefined8 uVar22;
  byte bVar23;
  int iVar24;
  Layer *pLVar25;
  Mat *this_00;
  Mat *this_01;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  uint uVar35;
  uint uVar36;
  long lVar37;
  void *pvVar38;
  long lVar39;
  undefined1 (*pauVar40) [64];
  undefined4 *puVar41;
  long lVar42;
  ulong uVar43;
  uint uVar44;
  uint _w;
  undefined4 *puVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  void *pvVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  ParamDict pd;
  void *local_1b8;
  void *local_1a8;
  void *local_1a0;
  void *local_190;
  void *local_188;
  void *local_180;
  void *local_178;
  void *local_168;
  void *local_160;
  void *local_158;
  void *local_150;
  void *local_148;
  void *local_140;
  uint local_108;
  Mat local_f8;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  void *local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  pLVar25 = create_layer(0xe);
  this->flatten = pLVar25;
  ParamDict::ParamDict((ParamDict *)&local_f8);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&local_f8);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict((ParamDict *)&local_f8);
  if ((opt->use_int8_inference == true) &&
     (*(long *)(&this->field_0x140 + (long)this->_vptr_InnerProduct_x86_avx512[-3]) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  iVar24 = cpu_support_x86_f16c();
  if ((iVar24 != 0) && (opt->use_fp16_storage == true)) {
    create_pipeline_fp16s(this,opt);
    return 0;
  }
  p_Var5 = this->_vptr_InnerProduct_x86_avx512[-3];
  uVar44 = *(uint *)(&this->field_0xd0 + (long)p_Var5);
  uVar33 = (ulong)uVar44;
  _w = *(int *)(&this->field_0xd8 + (long)p_Var5) / (int)uVar44;
  bVar23 = 1;
  if (opt->use_packing_layout == true) {
    if ((uVar44 & 0xf) == 0) {
      bVar23 = 0x10;
    }
    else if ((uVar44 & 7) == 0) {
      bVar23 = 8;
    }
    else {
      bVar23 = ((uVar44 & 3) == 0) * '\x03' + 1;
    }
  }
  this_01 = (Mat *)(&this->field_0x130 + (long)p_Var5);
  this_00 = &this->weight_data_tm;
  if (bVar23 < 8) {
    if (bVar23 == 1) {
      if (p_Var5 != (_func_int *)0xfffffffffffffee0) {
        piVar8 = *(int **)(&this->field_0x138 + (long)p_Var5);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + 1;
          UNLOCK();
        }
        piVar8 = (this->weight_data_tm).refcount;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            pvVar38 = (this->weight_data_tm).data;
            pAVar7 = (this->weight_data_tm).allocator;
            if (pAVar7 == (Allocator *)0x0) {
              if (pvVar38 != (void *)0x0) {
                free(pvVar38);
              }
            }
            else {
              (*pAVar7->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data_tm).cstep = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
        this_00->data = (void *)0x0;
        (this->weight_data_tm).refcount = (int *)0x0;
        (this->weight_data_tm).dims = 0;
        (this->weight_data_tm).w = 0;
        (this->weight_data_tm).h = 0;
        (this->weight_data_tm).d = 0;
        (this->weight_data_tm).c = 0;
        piVar8 = *(int **)(&this->field_0x138 + (long)p_Var5);
        (this->weight_data_tm).data = this_01->data;
        (this->weight_data_tm).refcount = piVar8;
        (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x140 + (long)p_Var5);
        (this->weight_data_tm).elempack = *(int *)(&this->field_0x148 + (long)p_Var5);
        (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x150 + (long)p_Var5);
        uVar21 = *(undefined8 *)(&this->field_0x158 + (long)p_Var5);
        uVar22 = *(undefined8 *)(&this->field_0x160 + (long)p_Var5);
        (this->weight_data_tm).dims = (int)uVar21;
        (this->weight_data_tm).w = (int)((ulong)uVar21 >> 0x20);
        (this->weight_data_tm).h = (int)uVar22;
        (this->weight_data_tm).d = (int)((ulong)uVar22 >> 0x20);
        (this->weight_data_tm).c = *(int *)(&this->field_0x168 + (long)p_Var5);
        (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x170 + (long)p_Var5);
      }
      goto LAB_002b596e;
    }
  }
  else {
    if (bVar23 != 8) {
      if (bVar23 == 0x10) {
        Mat::reshape(&local_f8,this_01,_w,uVar44,(Allocator *)0x0);
        uVar36 = uVar44 + 0xf;
        if (-1 < (int)uVar44) {
          uVar36 = uVar44;
        }
        Mat::create(this_00,_w,(int)uVar36 >> 4,0x40,0x10,(Allocator *)0x0);
        if (0xf < (int)uVar44) {
          lVar32 = 1;
          lVar48 = 0xb;
          local_78 = 9;
          local_80 = 8;
          local_88 = 7;
          local_90 = 6;
          local_98 = 5;
          local_a0 = 4;
          local_a8 = 3;
          lVar42 = 2;
          lVar51 = 0xf;
          uVar31 = 0;
          lVar54 = 10;
          lVar27 = 0xc;
          lVar29 = 0xd;
          lVar47 = 0xe;
          do {
            local_48 = lVar47;
            local_50 = lVar29;
            local_58 = lVar27;
            local_60 = lVar54;
            local_68 = uVar31;
            local_40 = lVar51;
            local_38 = lVar42;
            pauVar40 = (undefined1 (*) [64])
                       ((long)(this->weight_data_tm).w * (local_68 >> 4) *
                        (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
            lVar42 = (long)local_f8.w;
            if ((int)_w < 0x10) {
              lVar42 = local_f8.elemsize * lVar42;
              local_180 = (void *)(lVar42 * local_68 + (long)local_f8.data);
              local_1b8 = (void *)((local_68 | 1) * lVar42 + (long)local_f8.data);
              local_160 = (void *)((local_68 | 2) * lVar42 + (long)local_f8.data);
              local_1a0 = (void *)((local_68 | 3) * lVar42 + (long)local_f8.data);
              local_190 = (void *)((local_68 | 4) * lVar42 + (long)local_f8.data);
              local_1a8 = (void *)((local_68 | 5) * lVar42 + (long)local_f8.data);
              pvVar50 = (void *)((local_68 | 6) * lVar42 + (long)local_f8.data);
              local_158 = (void *)((local_68 | 7) * lVar42 + (long)local_f8.data);
              local_150 = (void *)((local_68 | 8) * lVar42 + (long)local_f8.data);
              pvVar38 = (void *)((local_68 | 9) * lVar42 + (long)local_f8.data);
              local_178 = (void *)((local_68 | 10) * lVar42 + (long)local_f8.data);
              local_168 = (void *)((local_68 | 0xb) * lVar42 + (long)local_f8.data);
              local_140 = (void *)((local_68 | 0xc) * lVar42 + (long)local_f8.data);
              local_148 = (void *)((local_68 | 0xd) * lVar42 + (long)local_f8.data);
              local_188 = (void *)((local_68 | 0xe) * lVar42 + (long)local_f8.data);
              local_70 = (void *)(lVar42 * (local_68 | 0xf) + (long)local_f8.data);
              uVar44 = 0;
            }
            else {
              lVar51 = local_f8.elemsize * local_68 * lVar42;
              lVar54 = local_f8.elemsize * lVar32 * lVar42;
              lVar46 = local_f8.elemsize * local_38 * lVar42;
              lVar27 = local_f8.elemsize * local_40 * lVar42;
              lVar29 = local_f8.elemsize * local_48 * lVar42;
              lVar30 = local_f8.elemsize * local_50 * lVar42;
              lVar52 = local_f8.elemsize * local_58 * lVar42;
              lVar37 = local_f8.elemsize * lVar48 * lVar42;
              lVar39 = local_f8.elemsize * local_60 * lVar42;
              lVar47 = local_f8.elemsize * local_78 * lVar42;
              lVar28 = local_f8.elemsize * local_80 * lVar42;
              lVar26 = local_f8.elemsize * local_88 * lVar42;
              lVar49 = local_f8.elemsize * local_90 * lVar42;
              lVar53 = local_f8.elemsize * local_98 * lVar42;
              lVar34 = local_f8.elemsize * local_a0 * lVar42;
              lVar42 = local_f8.elemsize * local_a8 * lVar42;
              iVar24 = 0xf;
              local_1a0 = local_f8.data;
              do {
                auVar67 = *(undefined1 (*) [64])((long)local_1a0 + lVar51);
                auVar68 = *(undefined1 (*) [64])((long)local_1a0 + lVar54);
                auVar69 = *(undefined1 (*) [64])((long)local_1a0 + lVar46);
                auVar70 = *(undefined1 (*) [64])((long)local_1a0 + lVar42);
                auVar71 = *(undefined1 (*) [64])((long)local_1a0 + lVar34);
                auVar72 = *(undefined1 (*) [64])((long)local_1a0 + lVar53);
                auVar73 = *(undefined1 (*) [64])((long)local_1a0 + lVar49);
                auVar74 = *(undefined1 (*) [64])((long)local_1a0 + lVar26);
                auVar75 = *(undefined1 (*) [64])((long)local_1a0 + lVar28);
                auVar76 = *(undefined1 (*) [64])((long)local_1a0 + lVar47);
                auVar77 = *(undefined1 (*) [64])((long)local_1a0 + lVar39);
                auVar78 = *(undefined1 (*) [64])((long)local_1a0 + lVar37);
                auVar79 = *(undefined1 (*) [64])((long)local_1a0 + lVar52);
                auVar80 = *(undefined1 (*) [64])((long)local_1a0 + lVar30);
                auVar81 = *(undefined1 (*) [64])((long)local_1a0 + lVar29);
                auVar82 = *(undefined1 (*) [64])((long)local_1a0 + lVar27);
                auVar66 = vunpcklps_avx512f(auVar67,auVar68);
                auVar67 = vunpckhps_avx512f(auVar67,auVar68);
                auVar68 = vunpcklps_avx512f(auVar69,auVar70);
                auVar69 = vunpckhps_avx512f(auVar69,auVar70);
                auVar70 = vunpcklps_avx512f(auVar71,auVar72);
                auVar71 = vunpckhps_avx512f(auVar71,auVar72);
                auVar72 = vunpcklps_avx512f(auVar73,auVar74);
                auVar73 = vunpckhps_avx512f(auVar73,auVar74);
                auVar74 = vunpcklps_avx512f(auVar75,auVar76);
                auVar75 = vunpckhps_avx512f(auVar75,auVar76);
                auVar76 = vunpcklps_avx512f(auVar77,auVar78);
                auVar77 = vunpckhps_avx512f(auVar77,auVar78);
                auVar78 = vunpcklps_avx512f(auVar79,auVar80);
                auVar79 = vunpckhps_avx512f(auVar79,auVar80);
                auVar80 = vunpcklps_avx512f(auVar81,auVar82);
                auVar81 = vunpckhps_avx512f(auVar81,auVar82);
                auVar82 = vunpcklpd_avx512f(auVar66,auVar68);
                auVar68 = vunpckhpd_avx512f(auVar66,auVar68);
                auVar66 = vunpcklpd_avx512f(auVar67,auVar69);
                auVar67 = vunpckhpd_avx512f(auVar67,auVar69);
                auVar69 = vunpcklpd_avx512f(auVar70,auVar72);
                auVar70 = vunpckhpd_avx512f(auVar70,auVar72);
                auVar72 = vunpcklpd_avx512f(auVar71,auVar73);
                auVar71 = vunpckhpd_avx512f(auVar71,auVar73);
                auVar73 = vunpcklpd_avx512f(auVar74,auVar76);
                auVar74 = vunpckhpd_avx512f(auVar74,auVar76);
                auVar76 = vunpcklpd_avx512f(auVar75,auVar77);
                auVar75 = vunpckhpd_avx512f(auVar75,auVar77);
                auVar77 = vunpcklpd_avx512f(auVar78,auVar80);
                auVar78 = vunpckhpd_avx512f(auVar78,auVar80);
                auVar80 = vunpcklpd_avx512f(auVar79,auVar81);
                auVar79 = vunpckhpd_avx512f(auVar79,auVar81);
                auVar81 = vshuff64x2_avx512f(auVar82,auVar69,0x88);
                auVar83 = vshuff64x2_avx512f(auVar73,auVar77,0x88);
                auVar84 = vshuff64x2_avx512f(auVar68,auVar70,0x88);
                auVar85 = vshuff64x2_avx512f(auVar74,auVar78,0x88);
                auVar86 = vshuff64x2_avx512f(auVar66,auVar72,0x88);
                auVar87 = vshuff64x2_avx512f(auVar76,auVar80,0x88);
                auVar88 = vshuff64x2_avx512f(auVar67,auVar71,0x88);
                auVar89 = vshuff64x2_avx512f(auVar75,auVar79,0x88);
                auVar69 = vshuff64x2_avx512f(auVar82,auVar69,0xdd);
                auVar73 = vshuff64x2_avx512f(auVar73,auVar77,0xdd);
                auVar68 = vshuff64x2_avx512f(auVar68,auVar70,0xdd);
                auVar70 = vshuff64x2_avx512f(auVar74,auVar78,0xdd);
                auVar72 = vshuff64x2_avx512f(auVar66,auVar72,0xdd);
                auVar74 = vshuff64x2_avx512f(auVar76,auVar80,0xdd);
                auVar67 = vshuff64x2_avx512f(auVar67,auVar71,0xdd);
                auVar71 = vshuff64x2_avx512f(auVar75,auVar79,0xdd);
                auVar75 = vshuff64x2_avx512f(auVar81,auVar83,0x88);
                auVar76 = vshuff64x2_avx512f(auVar84,auVar85,0x88);
                auVar77 = vshuff64x2_avx512f(auVar86,auVar87,0x88);
                auVar78 = vshuff64x2_avx512f(auVar88,auVar89,0x88);
                auVar79 = vshuff64x2_avx512f(auVar69,auVar73,0x88);
                auVar80 = vshuff64x2_avx512f(auVar68,auVar70,0x88);
                auVar82 = vshuff64x2_avx512f(auVar72,auVar74,0x88);
                auVar66 = vshuff64x2_avx512f(auVar67,auVar71,0x88);
                auVar81 = vshuff64x2_avx512f(auVar81,auVar83,0xdd);
                auVar83 = vshuff64x2_avx512f(auVar84,auVar85,0xdd);
                auVar84 = vshuff64x2_avx512f(auVar86,auVar87,0xdd);
                auVar85 = vshuff64x2_avx512f(auVar88,auVar89,0xdd);
                auVar69 = vshuff64x2_avx512f(auVar69,auVar73,0xdd);
                auVar68 = vshuff64x2_avx512f(auVar68,auVar70,0xdd);
                auVar70 = vshuff64x2_avx512f(auVar72,auVar74,0xdd);
                auVar67 = vshuff64x2_avx512f(auVar67,auVar71,0xdd);
                *pauVar40 = auVar75;
                pauVar40[1] = auVar76;
                pauVar40[2] = auVar77;
                pauVar40[3] = auVar78;
                pauVar40[4] = auVar79;
                pauVar40[5] = auVar80;
                pauVar40[6] = auVar82;
                pauVar40[7] = auVar66;
                pauVar40[8] = auVar81;
                pauVar40[9] = auVar83;
                pauVar40[10] = auVar84;
                pauVar40[0xb] = auVar85;
                pauVar40[0xc] = auVar69;
                pauVar40[0xd] = auVar68;
                pauVar40[0xe] = auVar70;
                pauVar40[0xf] = auVar67;
                pauVar40 = pauVar40 + 0x10;
                local_1a0 = (void *)((long)local_1a0 + 0x40);
                iVar24 = iVar24 + 0x10;
              } while (iVar24 < (int)_w);
              local_180 = (void *)(lVar51 + (long)local_1a0);
              local_1b8 = (void *)(lVar54 + (long)local_1a0);
              local_160 = (void *)(lVar46 + (long)local_1a0);
              local_70 = (void *)(lVar27 + (long)local_1a0);
              local_188 = (void *)(lVar29 + (long)local_1a0);
              local_148 = (void *)(lVar30 + (long)local_1a0);
              local_140 = (void *)(lVar52 + (long)local_1a0);
              local_168 = (void *)(lVar37 + (long)local_1a0);
              local_178 = (void *)(lVar39 + (long)local_1a0);
              pvVar38 = (void *)(lVar47 + (long)local_1a0);
              local_150 = (void *)(lVar28 + (long)local_1a0);
              local_158 = (void *)(lVar26 + (long)local_1a0);
              pvVar50 = (void *)(lVar49 + (long)local_1a0);
              local_1a8 = (void *)(lVar53 + (long)local_1a0);
              local_190 = (void *)(lVar34 + (long)local_1a0);
              local_1a0 = (void *)(lVar42 + (long)local_1a0);
              uVar44 = _w & 0xfffffff0;
            }
            if ((int)(uVar44 | 7) < (int)_w) {
              lVar42 = 0;
              uVar36 = uVar44;
              do {
                auVar55 = vunpcklps_avx512vl(*(undefined1 (*) [32])((long)local_180 + lVar42),
                                             *(undefined1 (*) [32])((long)local_1b8 + lVar42));
                auVar9 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_180 + lVar42),
                                       *(undefined1 (*) [32])((long)local_1b8 + lVar42));
                auVar19 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_160 + lVar42),
                                        *(undefined1 (*) [32])((long)local_1a0 + lVar42));
                auVar10 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_160 + lVar42),
                                        *(undefined1 (*) [32])((long)local_1a0 + lVar42));
                auVar65 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_190 + lVar42),
                                        *(undefined1 (*) [32])((long)local_1a8 + lVar42));
                auVar11 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_190 + lVar42),
                                        *(undefined1 (*) [32])((long)local_1a8 + lVar42));
                auVar90 = vunpcklps_avx(*(undefined1 (*) [32])((long)pvVar50 + lVar42),
                                        *(undefined1 (*) [32])((long)local_158 + lVar42));
                auVar12 = vunpckhps_avx(*(undefined1 (*) [32])((long)pvVar50 + lVar42),
                                        *(undefined1 (*) [32])((long)local_158 + lVar42));
                auVar91 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_150 + lVar42),
                                        *(undefined1 (*) [32])((long)pvVar38 + lVar42));
                auVar13 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_150 + lVar42),
                                        *(undefined1 (*) [32])((long)pvVar38 + lVar42));
                auVar92 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_178 + lVar42),
                                        *(undefined1 (*) [32])((long)local_168 + lVar42));
                auVar14 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_178 + lVar42),
                                        *(undefined1 (*) [32])((long)local_168 + lVar42));
                auVar20 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_140 + lVar42),
                                        *(undefined1 (*) [32])((long)local_148 + lVar42));
                auVar15 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_140 + lVar42),
                                        *(undefined1 (*) [32])((long)local_148 + lVar42));
                auVar58 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_188 + lVar42),
                                        *(undefined1 (*) [32])((long)local_70 + lVar42));
                auVar16 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_188 + lVar42),
                                        *(undefined1 (*) [32])((long)local_70 + lVar42));
                auVar56 = vunpcklpd_avx512vl(auVar55,auVar19);
                auVar55 = vunpckhpd_avx512vl(auVar55,auVar19);
                auVar57 = vunpcklpd_avx512vl(auVar9,auVar10);
                auVar9 = vunpckhpd_avx(auVar9,auVar10);
                auVar19 = vunpcklpd_avx(auVar65,auVar90);
                auVar10 = vunpckhpd_avx(auVar65,auVar90);
                auVar65 = vunpcklpd_avx(auVar11,auVar12);
                auVar11 = vunpckhpd_avx(auVar11,auVar12);
                auVar90 = vunpcklpd_avx(auVar91,auVar92);
                auVar12 = vunpckhpd_avx(auVar91,auVar92);
                auVar91 = vunpcklpd_avx(auVar13,auVar14);
                auVar13 = vunpckhpd_avx(auVar13,auVar14);
                auVar92 = vunpcklpd_avx(auVar20,auVar58);
                auVar14 = vunpckhpd_avx(auVar20,auVar58);
                auVar20 = vunpcklpd_avx(auVar15,auVar16);
                auVar15 = vunpckhpd_avx(auVar15,auVar16);
                auVar93._16_16_ = auVar19._0_16_;
                auVar93._0_16_ = auVar56._0_16_;
                auVar58 = vinsertf32x4_avx512vl(auVar90,auVar92._0_16_,1);
                auVar59 = vinsertf32x4_avx512vl(auVar55,auVar10._0_16_,1);
                auVar60 = vinsertf32x4_avx512vl(auVar12,auVar14._0_16_,1);
                auVar61 = vinsertf32x4_avx512vl(auVar57,auVar65._0_16_,1);
                auVar62 = vinsertf32x4_avx512vl(auVar91,auVar20._0_16_,1);
                auVar63 = vinsertf32x4_avx512vl(auVar9,auVar11._0_16_,1);
                auVar64 = vinsertf32x4_avx512vl(auVar13,auVar15._0_16_,1);
                auVar16 = vperm2f128_avx(auVar56,auVar19,0x31);
                auVar19 = vperm2f128_avx(auVar90,auVar92,0x31);
                auVar10 = vperm2f128_avx(auVar55,auVar10,0x31);
                auVar12 = vperm2f128_avx(auVar12,auVar14,0x31);
                auVar65 = vshuff64x2_avx512vl(auVar57,auVar65,3);
                auVar14 = vperm2f128_avx(auVar91,auVar20,0x31);
                auVar9 = vperm2f128_avx(auVar9,auVar11,0x31);
                auVar11 = vperm2f128_avx(auVar13,auVar15,0x31);
                *(undefined1 (*) [32])*pauVar40 = auVar93;
                *(undefined1 (*) [32])((long)*pauVar40 + 0x20) = auVar58;
                *(undefined1 (*) [32])pauVar40[1] = auVar59;
                *(undefined1 (*) [32])(pauVar40[1] + 0x20) = auVar60;
                *(undefined1 (*) [32])pauVar40[2] = auVar61;
                *(undefined1 (*) [32])(pauVar40[2] + 0x20) = auVar62;
                *(undefined1 (*) [32])pauVar40[3] = auVar63;
                *(undefined1 (*) [32])(pauVar40[3] + 0x20) = auVar64;
                *(undefined1 (*) [32])pauVar40[4] = auVar16;
                *(undefined1 (*) [32])(pauVar40[4] + 0x20) = auVar19;
                *(undefined1 (*) [32])pauVar40[5] = auVar10;
                *(undefined1 (*) [32])(pauVar40[5] + 0x20) = auVar12;
                *(undefined1 (*) [32])pauVar40[6] = auVar65;
                *(undefined1 (*) [32])(pauVar40[6] + 0x20) = auVar14;
                *(undefined1 (*) [32])pauVar40[7] = auVar9;
                *(undefined1 (*) [32])(pauVar40[7] + 0x20) = auVar11;
                pauVar40 = pauVar40 + 8;
                uVar44 = uVar36 + 8;
                lVar42 = lVar42 + 0x20;
                iVar24 = uVar36 + 0xf;
                uVar36 = uVar44;
              } while (iVar24 < (int)_w);
              local_180 = (void *)((long)local_180 + lVar42);
              local_1b8 = (void *)((long)local_1b8 + lVar42);
              local_160 = (void *)((long)local_160 + lVar42);
              local_70 = (void *)((long)local_70 + lVar42);
              local_188 = (void *)((long)local_188 + lVar42);
              local_148 = (void *)((long)local_148 + lVar42);
              local_140 = (void *)((long)local_140 + lVar42);
              local_168 = (void *)((long)local_168 + lVar42);
              local_178 = (void *)((long)local_178 + lVar42);
              pvVar38 = (void *)((long)pvVar38 + lVar42);
              local_150 = (void *)((long)local_150 + lVar42);
              local_158 = (void *)((long)local_158 + lVar42);
              pvVar50 = (void *)((long)pvVar50 + lVar42);
              local_1a8 = (void *)((long)local_1a8 + lVar42);
              local_190 = (void *)((long)local_190 + lVar42);
              local_1a0 = (void *)((long)local_1a0 + lVar42);
            }
            if ((int)uVar44 < (int)_w) {
              lVar42 = 0;
              do {
                *(undefined4 *)*pauVar40 = *(undefined4 *)((long)local_180 + lVar42 * 4);
                *(undefined4 *)((long)*pauVar40 + 4) = *(undefined4 *)((long)local_1b8 + lVar42 * 4)
                ;
                *(undefined4 *)((long)*pauVar40 + 8) = *(undefined4 *)((long)local_160 + lVar42 * 4)
                ;
                *(undefined4 *)((long)*pauVar40 + 0xc) =
                     *(undefined4 *)((long)local_1a0 + lVar42 * 4);
                *(undefined4 *)((long)*pauVar40 + 0x10) =
                     *(undefined4 *)((long)local_190 + lVar42 * 4);
                *(undefined4 *)((long)*pauVar40 + 0x14) =
                     *(undefined4 *)((long)local_1a8 + lVar42 * 4);
                *(undefined4 *)((long)*pauVar40 + 0x18) =
                     *(undefined4 *)((long)pvVar50 + lVar42 * 4);
                *(undefined4 *)((long)*pauVar40 + 0x1c) =
                     *(undefined4 *)((long)local_158 + lVar42 * 4);
                *(undefined4 *)((long)*pauVar40 + 0x20) =
                     *(undefined4 *)((long)local_150 + lVar42 * 4);
                *(undefined4 *)((long)*pauVar40 + 0x24) =
                     *(undefined4 *)((long)pvVar38 + lVar42 * 4);
                *(undefined4 *)((long)*pauVar40 + 0x28) =
                     *(undefined4 *)((long)local_178 + lVar42 * 4);
                *(undefined4 *)((long)*pauVar40 + 0x2c) =
                     *(undefined4 *)((long)local_168 + lVar42 * 4);
                *(undefined4 *)((long)*pauVar40 + 0x30) =
                     *(undefined4 *)((long)local_140 + lVar42 * 4);
                *(undefined4 *)((long)*pauVar40 + 0x34) =
                     *(undefined4 *)((long)local_148 + lVar42 * 4);
                *(undefined4 *)((long)*pauVar40 + 0x38) =
                     *(undefined4 *)((long)local_188 + lVar42 * 4);
                *(undefined4 *)((long)*pauVar40 + 0x3c) =
                     *(undefined4 *)((long)local_70 + lVar42 * 4);
                pauVar40 = pauVar40 + 1;
                lVar42 = lVar42 + 1;
              } while (_w - uVar44 != (int)lVar42);
            }
            lVar32 = lVar32 + 0x10;
            lVar48 = lVar48 + 0x10;
            local_78 = local_78 + 0x10;
            local_80 = local_80 + 0x10;
            local_88 = local_88 + 0x10;
            local_90 = local_90 + 0x10;
            local_98 = local_98 + 0x10;
            local_a0 = local_a0 + 0x10;
            local_a8 = local_a8 + 0x10;
            lVar42 = local_38 + 0x10;
            lVar51 = local_40 + 0x10;
            uVar31 = local_68 + 0x10;
            lVar54 = local_60 + 0x10;
            lVar27 = local_58 + 0x10;
            lVar29 = local_50 + 0x10;
            lVar47 = local_48 + 0x10;
          } while (local_68 + 0x1f < uVar33);
        }
        if (local_f8.refcount != (int *)0x0) {
          LOCK();
          *local_f8.refcount = *local_f8.refcount + -1;
          UNLOCK();
          if (*local_f8.refcount == 0) {
            if (local_f8.allocator == (Allocator *)0x0) {
              if (local_f8.data != (void *)0x0) {
                free(local_f8.data);
              }
            }
            else {
              (*(local_f8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      goto LAB_002b596e;
    }
    Mat::reshape(&local_f8,this_01,_w,uVar44,(Allocator *)0x0);
    uVar36 = uVar44 + 7;
    if (-1 < (int)uVar44) {
      uVar36 = uVar44;
    }
    Mat::create(this_00,_w,(int)uVar36 >> 3,0x20,8,(Allocator *)0x0);
    if (7 < (int)uVar44) {
      local_108 = _w & 0xfffffff0;
      lVar27 = 7;
      lVar42 = 6;
      lVar51 = 5;
      lVar54 = 4;
      local_190 = (void *)0x3;
      local_160 = (void *)0x2;
      local_158 = (void *)0x1;
      local_178 = (void *)0x0;
      uVar31 = 0;
      do {
        lVar47 = (long)(this->weight_data_tm).w;
        pvVar38 = (this->weight_data_tm).data;
        sVar6 = (this->weight_data_tm).elemsize;
        puVar45 = (undefined4 *)((uVar31 >> 3) * lVar47 * sVar6 + (long)pvVar38);
        lVar29 = (long)local_f8.w;
        if ((int)_w < 0x10) {
          lVar29 = local_f8.elemsize * lVar29;
          lVar37 = lVar29 * uVar31;
          lVar34 = (uVar31 | 1) * lVar29;
          lVar30 = (uVar31 | 2) * lVar29;
          lVar28 = (uVar31 | 3) * lVar29;
          lVar26 = (uVar31 | 4) * lVar29;
          lVar39 = (uVar31 | 5) * lVar29;
          lVar48 = (uVar31 | 6) * lVar29;
          lVar32 = lVar29 * (uVar31 | 7);
          uVar36 = 0;
        }
        else {
          lVar32 = local_f8.elemsize * lVar27 * lVar29;
          lVar48 = local_f8.elemsize * lVar42 * lVar29;
          lVar39 = local_f8.elemsize * lVar51 * lVar29;
          lVar26 = local_f8.elemsize * lVar54 * lVar29;
          lVar28 = local_f8.elemsize * (long)local_190 * lVar29;
          lVar30 = local_f8.elemsize * (long)local_160 * lVar29;
          lVar34 = local_f8.elemsize * (long)local_158 * lVar29;
          lVar29 = local_f8.elemsize * uVar31 * lVar29;
          lVar47 = sVar6 * (long)local_178 * lVar47;
          iVar24 = 0xf;
          lVar37 = 0;
          do {
            auVar67 = *(undefined1 (*) [64])((long)local_f8.data + lVar37 + lVar29);
            auVar68 = *(undefined1 (*) [64])((long)local_f8.data + lVar37 + lVar34);
            auVar69 = *(undefined1 (*) [64])((long)local_f8.data + lVar37 + lVar30);
            auVar70 = *(undefined1 (*) [64])((long)local_f8.data + lVar37 + lVar28);
            auVar71 = *(undefined1 (*) [64])((long)local_f8.data + lVar37 + lVar26);
            auVar72 = *(undefined1 (*) [64])((long)local_f8.data + lVar37 + lVar39);
            auVar73 = *(undefined1 (*) [64])((long)local_f8.data + lVar37 + lVar48);
            auVar74 = *(undefined1 (*) [64])((long)local_f8.data + lVar37 + lVar32);
            auVar75 = vunpcklps_avx512f(auVar67,auVar68);
            auVar67 = vunpckhps_avx512f(auVar67,auVar68);
            auVar68 = vunpcklps_avx512f(auVar69,auVar70);
            auVar69 = vunpckhps_avx512f(auVar69,auVar70);
            auVar70 = vunpcklps_avx512f(auVar71,auVar72);
            auVar71 = vunpckhps_avx512f(auVar71,auVar72);
            auVar72 = vunpcklps_avx512f(auVar73,auVar74);
            auVar73 = vunpckhps_avx512f(auVar73,auVar74);
            auVar74 = vunpcklpd_avx512f(auVar75,auVar68);
            auVar68 = vunpckhpd_avx512f(auVar75,auVar68);
            auVar75 = vunpcklpd_avx512f(auVar67,auVar69);
            auVar67 = vunpckhpd_avx512f(auVar67,auVar69);
            auVar69 = vunpcklpd_avx512f(auVar70,auVar72);
            auVar70 = vunpckhpd_avx512f(auVar70,auVar72);
            auVar72 = vunpcklpd_avx512f(auVar71,auVar73);
            auVar71 = vunpckhpd_avx512f(auVar71,auVar73);
            auVar73 = vshuff64x2_avx512f(auVar74,auVar69,0x88);
            auVar76 = vshuff64x2_avx512f(auVar68,auVar70,0x88);
            auVar77 = vshuff64x2_avx512f(auVar75,auVar72,0x88);
            auVar78 = vshuff64x2_avx512f(auVar67,auVar71,0x88);
            auVar69 = vshuff64x2_avx512f(auVar74,auVar69,0xdd);
            auVar68 = vshuff64x2_avx512f(auVar68,auVar70,0xdd);
            auVar70 = vshuff64x2_avx512f(auVar75,auVar72,0xdd);
            auVar67 = vshuff64x2_avx512f(auVar67,auVar71,0xdd);
            auVar71 = vshuff64x2_avx512f(auVar73,auVar76,0x88);
            auVar72 = vshuff64x2_avx512f(auVar77,auVar78,0x88);
            auVar74 = vshuff64x2_avx512f(auVar69,auVar68,0x88);
            auVar75 = vshuff64x2_avx512f(auVar70,auVar67,0x88);
            auVar73 = vshuff64x2_avx512f(auVar73,auVar76,0xdd);
            auVar76 = vshuff64x2_avx512f(auVar77,auVar78,0xdd);
            auVar68 = vshuff64x2_avx512f(auVar69,auVar68,0xdd);
            auVar67 = vshuff64x2_avx512f(auVar70,auVar67,0xdd);
            *(undefined1 (*) [64])((long)pvVar38 + lVar37 * 8 + lVar47) = auVar71;
            *(undefined1 (*) [64])((long)pvVar38 + lVar37 * 8 + lVar47 + 0x40) = auVar72;
            *(undefined1 (*) [64])((long)pvVar38 + lVar37 * 8 + lVar47 + 0x80) = auVar74;
            *(undefined1 (*) [64])((long)pvVar38 + lVar37 * 8 + lVar47 + 0xc0) = auVar75;
            *(undefined1 (*) [64])((long)pvVar38 + lVar37 * 8 + lVar47 + 0x100) = auVar73;
            *(undefined1 (*) [64])((long)pvVar38 + lVar37 * 8 + lVar47 + 0x140) = auVar76;
            *(undefined1 (*) [64])((long)pvVar38 + lVar37 * 8 + lVar47 + 0x180) = auVar68;
            *(undefined1 (*) [64])((long)pvVar38 + lVar37 * 8 + lVar47 + 0x1c0) = auVar67;
            puVar45 = puVar45 + 0x80;
            iVar24 = iVar24 + 0x10;
            lVar37 = lVar37 + 0x40;
          } while (iVar24 < (int)_w);
          lVar32 = lVar32 + lVar37;
          lVar48 = lVar48 + lVar37;
          lVar39 = lVar39 + lVar37;
          lVar26 = lVar26 + lVar37;
          lVar28 = lVar28 + lVar37;
          lVar30 = lVar30 + lVar37;
          lVar34 = lVar34 + lVar37;
          lVar37 = lVar29 + lVar37;
          uVar36 = local_108;
        }
        local_1b8 = (void *)((long)local_f8.data + lVar30);
        lVar32 = (long)local_f8.data + lVar32;
        lVar37 = (long)local_f8.data + lVar37;
        lVar28 = (long)local_f8.data + lVar28;
        lVar34 = (long)local_f8.data + lVar34;
        lVar26 = (long)local_f8.data + lVar26;
        lVar39 = (long)local_f8.data + lVar39;
        lVar48 = (long)local_f8.data + lVar48;
        if ((int)(uVar36 | 7) < (int)_w) {
          lVar29 = 0;
          puVar41 = puVar45;
          uVar35 = uVar36;
          do {
            auVar9 = vunpcklps_avx(*(undefined1 (*) [32])(lVar37 + lVar29),
                                   *(undefined1 (*) [32])(lVar34 + lVar29));
            auVar10 = vunpckhps_avx(*(undefined1 (*) [32])(lVar37 + lVar29),
                                    *(undefined1 (*) [32])(lVar34 + lVar29));
            auVar15 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_1b8 + lVar29),
                                    *(undefined1 (*) [32])(lVar28 + lVar29));
            auVar11 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_1b8 + lVar29),
                                    *(undefined1 (*) [32])(lVar28 + lVar29));
            auVar19 = vunpcklps_avx(*(undefined1 (*) [32])(lVar26 + lVar29),
                                    *(undefined1 (*) [32])(lVar39 + lVar29));
            auVar12 = vunpckhps_avx(*(undefined1 (*) [32])(lVar26 + lVar29),
                                    *(undefined1 (*) [32])(lVar39 + lVar29));
            auVar65 = vunpcklps_avx(*(undefined1 (*) [32])(lVar48 + lVar29),
                                    *(undefined1 (*) [32])(lVar32 + lVar29));
            auVar13 = vunpckhps_avx(*(undefined1 (*) [32])(lVar48 + lVar29),
                                    *(undefined1 (*) [32])(lVar32 + lVar29));
            auVar14 = vunpcklpd_avx(auVar9,auVar15);
            auVar9 = vunpckhpd_avx(auVar9,auVar15);
            auVar15 = vunpcklpd_avx(auVar10,auVar11);
            auVar10 = vunpckhpd_avx(auVar10,auVar11);
            auVar16 = vunpcklpd_avx(auVar19,auVar65);
            auVar11 = vunpckhpd_avx(auVar19,auVar65);
            auVar19 = vunpcklpd_avx(auVar12,auVar13);
            auVar12 = vunpckhpd_avx(auVar12,auVar13);
            auVar65._16_16_ = auVar16._0_16_;
            auVar65._0_16_ = auVar14._0_16_;
            auVar90._16_16_ = auVar11._0_16_;
            auVar90._0_16_ = auVar9._0_16_;
            auVar91._16_16_ = auVar19._0_16_;
            auVar91._0_16_ = auVar15._0_16_;
            auVar92._16_16_ = auVar12._0_16_;
            auVar92._0_16_ = auVar10._0_16_;
            auVar13 = vperm2f128_avx(auVar14,auVar16,0x31);
            auVar9 = vperm2f128_avx(auVar9,auVar11,0x31);
            auVar11 = vperm2f128_avx(auVar15,auVar19,0x31);
            auVar10 = vperm2f128_avx(auVar10,auVar12,0x31);
            *(undefined1 (*) [32])(puVar45 + lVar29 * 2) = auVar65;
            *(undefined1 (*) [32])(puVar45 + lVar29 * 2 + 8) = auVar90;
            *(undefined1 (*) [32])(puVar45 + lVar29 * 2 + 0x10) = auVar91;
            *(undefined1 (*) [32])(puVar45 + lVar29 * 2 + 0x18) = auVar92;
            *(undefined1 (*) [32])(puVar45 + lVar29 * 2 + 0x20) = auVar13;
            *(undefined1 (*) [32])(puVar45 + lVar29 * 2 + 0x28) = auVar9;
            *(undefined1 (*) [32])(puVar45 + lVar29 * 2 + 0x30) = auVar11;
            *(undefined1 (*) [32])(puVar45 + lVar29 * 2 + 0x38) = auVar10;
            puVar41 = puVar41 + 0x40;
            uVar36 = uVar35 + 8;
            iVar24 = uVar35 + 0xf;
            lVar29 = lVar29 + 0x20;
            uVar35 = uVar36;
          } while (iVar24 < (int)_w);
          lVar32 = lVar32 + lVar29;
          lVar48 = lVar48 + lVar29;
          lVar39 = lVar39 + lVar29;
          lVar26 = lVar26 + lVar29;
          lVar28 = lVar28 + lVar29;
          local_1b8 = (void *)((long)local_1b8 + lVar29);
          lVar34 = lVar34 + lVar29;
          lVar37 = lVar37 + lVar29;
          puVar45 = puVar41;
        }
        if ((int)uVar36 < (int)_w) {
          lVar29 = 0;
          do {
            *puVar45 = *(undefined4 *)(lVar37 + lVar29 * 4);
            puVar45[1] = *(undefined4 *)(lVar34 + lVar29 * 4);
            puVar45[2] = *(undefined4 *)((long)local_1b8 + lVar29 * 4);
            puVar45[3] = *(undefined4 *)(lVar28 + lVar29 * 4);
            puVar45[4] = *(undefined4 *)(lVar26 + lVar29 * 4);
            puVar45[5] = *(undefined4 *)(lVar39 + lVar29 * 4);
            puVar45[6] = *(undefined4 *)(lVar48 + lVar29 * 4);
            puVar45[7] = *(undefined4 *)(lVar32 + lVar29 * 4);
            puVar45 = puVar45 + 8;
            lVar29 = lVar29 + 1;
          } while (_w - uVar36 != (int)lVar29);
        }
        uVar43 = uVar31 + 0xf;
        lVar27 = lVar27 + 8;
        lVar42 = lVar42 + 8;
        lVar51 = lVar51 + 8;
        lVar54 = lVar54 + 8;
        local_190 = (void *)((long)local_190 + 8);
        local_160 = (void *)((long)local_160 + 8);
        local_158 = (void *)((long)local_158 + 8);
        local_178 = (void *)((long)local_178 + 1);
        uVar31 = uVar31 + 8;
      } while (uVar43 < uVar33);
    }
    if (local_f8.refcount != (int *)0x0) {
      LOCK();
      *local_f8.refcount = *local_f8.refcount + -1;
      UNLOCK();
      if (*local_f8.refcount == 0) {
        if (local_f8.allocator == (Allocator *)0x0) {
          if (local_f8.data != (void *)0x0) {
            free(local_f8.data);
          }
        }
        else {
          (*(local_f8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (bVar23 == 4) {
    Mat::reshape(&local_f8,this_01,_w,uVar44,(Allocator *)0x0);
    uVar36 = uVar44 + 3;
    if (-1 < (int)uVar44) {
      uVar36 = uVar44;
    }
    Mat::create(this_00,_w,(int)uVar36 >> 2,0x10,4,(Allocator *)0x0);
    if (3 < (int)uVar44) {
      local_190._0_4_ = _w & 0xfffffffc;
      lVar42 = 3;
      lVar54 = 2;
      lVar51 = 1;
      local_1b8 = (void *)0x0;
      uVar31 = 0;
      do {
        lVar29 = (long)(this->weight_data_tm).w;
        pvVar38 = (this->weight_data_tm).data;
        sVar6 = (this->weight_data_tm).elemsize;
        puVar45 = (undefined4 *)((uVar31 >> 2) * lVar29 * sVar6 + (long)pvVar38);
        lVar27 = (long)local_f8.w;
        if ((int)_w < 4) {
          lVar27 = local_f8.elemsize * lVar27;
          lVar39 = lVar27 * uVar31;
          lVar48 = (uVar31 | 1) * lVar27;
          lVar32 = (uVar31 | 2) * lVar27;
          lVar47 = lVar27 * (uVar31 | 3);
          uVar44 = 0;
        }
        else {
          lVar47 = local_f8.elemsize * lVar42 * lVar27;
          lVar32 = local_f8.elemsize * lVar54 * lVar27;
          lVar48 = local_f8.elemsize * lVar51 * lVar27;
          lVar27 = local_f8.elemsize * uVar31 * lVar27;
          iVar24 = 3;
          lVar39 = 0;
          do {
            puVar41 = puVar45;
            auVar1 = *(undefined1 (*) [16])((long)local_f8.data + lVar39 + lVar27);
            auVar2 = *(undefined1 (*) [16])((long)local_f8.data + lVar39 + lVar48);
            auVar3 = *(undefined1 (*) [16])((long)local_f8.data + lVar39 + lVar32);
            auVar4 = *(undefined1 (*) [16])((long)local_f8.data + lVar39 + lVar47);
            auVar17 = vunpcklps_avx(auVar1,auVar2);
            auVar18 = vunpcklps_avx(auVar3,auVar4);
            auVar2 = vunpckhps_avx(auVar1,auVar2);
            auVar3 = vunpckhps_avx(auVar3,auVar4);
            auVar4 = vunpcklpd_avx(auVar17,auVar18);
            auVar1 = vunpckhpd_avx(auVar17,auVar18);
            auVar17 = vunpcklpd_avx(auVar2,auVar3);
            auVar2 = vunpckhpd_avx(auVar2,auVar3);
            puVar45 = (undefined4 *)
                      ((long)pvVar38 + lVar39 * 4 + sVar6 * (long)local_1b8 * lVar29 + 0x40);
            *(undefined1 (*) [16])(puVar45 + -0x10) = auVar4;
            *(undefined1 (*) [16])(puVar45 + -0xc) = auVar1;
            *(undefined1 (*) [16])(puVar45 + -8) = auVar17;
            *(undefined1 (*) [16])(puVar45 + -4) = auVar2;
            iVar24 = iVar24 + 4;
            lVar39 = lVar39 + 0x10;
          } while (iVar24 < (int)_w);
          puVar45 = puVar41 + 0x10;
          lVar47 = lVar47 + lVar39;
          lVar32 = lVar32 + lVar39;
          lVar48 = lVar48 + lVar39;
          lVar39 = lVar27 + lVar39;
          uVar44 = (uint)local_190;
        }
        if ((int)uVar44 < (int)_w) {
          lVar27 = 0;
          do {
            *puVar45 = *(undefined4 *)((long)local_f8.data + lVar27 * 4 + lVar39);
            puVar45[1] = *(undefined4 *)((long)local_f8.data + lVar27 * 4 + lVar48);
            puVar45[2] = *(undefined4 *)((long)local_f8.data + lVar27 * 4 + lVar32);
            puVar45[3] = *(undefined4 *)((long)local_f8.data + lVar27 * 4 + lVar47);
            puVar45 = puVar45 + 4;
            lVar27 = lVar27 + 1;
          } while (_w - uVar44 != (int)lVar27);
        }
        uVar43 = uVar31 + 7;
        lVar42 = lVar42 + 4;
        lVar54 = lVar54 + 4;
        lVar51 = lVar51 + 4;
        local_1b8 = (void *)((long)local_1b8 + 1);
        uVar31 = uVar31 + 4;
      } while (uVar43 < uVar33);
    }
    if (local_f8.refcount != (int *)0x0) {
      LOCK();
      *local_f8.refcount = *local_f8.refcount + -1;
      UNLOCK();
      if (*local_f8.refcount == 0) {
        if (local_f8.allocator == (Allocator *)0x0) {
          if (local_f8.data != (void *)0x0) {
            free(local_f8.data);
          }
        }
        else {
          (*(local_f8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
LAB_002b596e:
  if (opt->lightmode == true) {
    p_Var5 = this->_vptr_InnerProduct_x86_avx512[-3];
    piVar8 = *(int **)(&this->field_0x138 + (long)p_Var5);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (*(long **)(&this->field_0x150 + (long)p_Var5) == (long *)0x0) {
          if (*(void **)(&this->field_0x130 + (long)p_Var5) != (void *)0x0) {
            free(*(void **)(&this->field_0x130 + (long)p_Var5));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var5) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x170 + (long)p_Var5) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var5) = 0;
    *(undefined8 *)(&this->field_0x144 + (long)p_Var5) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var5) = 0;
    *(undefined8 *)(&this->field_0x138 + (long)p_Var5) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var5) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var5) = 0;
    *(undefined4 *)(&this->field_0x168 + (long)p_Var5) = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx512::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}